

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::MergeReturnPass::ProcessStructured
          (MergeReturnPass *this,Function *function,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *return_blocks)

{
  pointer *ppSVar1;
  pointer pSVar2;
  BasicBlock *block_00;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  CFG *pCVar6;
  __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  _Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  BasicBlock *block;
  Function *local_98;
  vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
  *local_90;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> order;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  predicated;
  
  bVar3 = HasNontrivialUnreachableBlocks(this,function);
  if (bVar3) {
    if ((this->super_MemPass).super_Pass.consumer_.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&predicated,
                 "Module contains unreachable blocks during merge return.  Run dead branch elimination before merge return."
                 ,(allocator<char> *)&order);
      order.
      super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      order.
      super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      order.
      super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl._M_node._M_size = 0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&(this->super_MemPass).super_Pass.consumer_,SPV_MSG_ERROR,(char *)0x0,
                   (spv_position_t *)&order,(char *)predicated._M_h._M_buckets);
      std::__cxx11::string::_M_dispose();
      return false;
    }
  }
  else {
    RecordImmediateDominators(this,function);
    bVar3 = AddSingleCaseSwitchAroundFunction(this);
    if (bVar3) {
      order.
      super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl._M_node._M_size = 0;
      order.
      super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&order;
      order.
      super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&order;
      pCVar6 = Pass::cfg((Pass *)this);
      local_98 = function;
      CFG::ComputeStructuredOrder
                (pCVar6,function,
                 (BasicBlock *)
                 (((function->blocks_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t,&order);
      local_90 = (vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
                  *)&this->state_;
      pSVar2 = (this->state_).
               super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->state_).
          super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
          ._M_impl.super__Vector_impl_data._M_finish != pSVar2) {
        (this->state_).
        super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar2;
      }
      predicated._M_h._M_buckets = (__buckets_ptr)0x0;
      block = (BasicBlock *)0x0;
      std::
      vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
      ::emplace_back<decltype(nullptr),decltype(nullptr)>(local_90,(void **)&predicated,&block);
      p_Var9 = (_List_node_base *)&order;
      while (p_Var9 = (((_List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                         *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var9 != (_List_node_base *)&order) {
        block_00 = (BasicBlock *)p_Var9[1]._M_next;
        pCVar6 = Pass::cfg((Pass *)this);
        if (((&pCVar6->pseudo_entry_block_ != block_00) &&
            (pCVar6 = Pass::cfg((Pass *)this), &pCVar6->pseudo_exit_block_ != block_00)) &&
           (block_00 != this->final_return_block_)) {
          uVar4 = Instruction::result_id
                            ((block_00->label_)._M_t.
                             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                             _M_head_impl);
          uVar5 = StructuredControlState::CurrentMergeId
                            ((this->state_).
                             super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
          if (uVar4 == uVar5) {
            ppSVar1 = &(this->state_).
                       super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + -1;
          }
          ProcessStructuredBlock(this,block_00);
          GenerateState(this,block_00);
        }
      }
      pSVar2 = (this->state_).
               super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->state_).
          super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
          ._M_impl.super__Vector_impl_data._M_finish != pSVar2) {
        (this->state_).
        super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar2;
      }
      predicated._M_h._M_buckets = (__buckets_ptr)0x0;
      block = (BasicBlock *)0x0;
      std::
      vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
      ::emplace_back<decltype(nullptr),decltype(nullptr)>(local_90,(void **)&predicated,&block);
      predicated._M_h._M_buckets = &predicated._M_h._M_single_bucket;
      predicated._M_h._M_bucket_count = 1;
      predicated._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      predicated._M_h._M_element_count = 0;
      predicated._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      predicated._M_h._M_rehash_policy._M_next_resize = 0;
      predicated._M_h._M_single_bucket = (__node_base_ptr)0x0;
      p_Var9 = (_List_node_base *)&order;
      p_Var8 = p_Var9;
      while( true ) {
        p_Var8 = (((_List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var8 == p_Var9) break;
        block = (BasicBlock *)p_Var8[1]._M_next;
        pCVar6 = Pass::cfg((Pass *)this);
        if ((&pCVar6->pseudo_entry_block_ != block) &&
           (pCVar6 = Pass::cfg((Pass *)this), &pCVar6->pseudo_exit_block_ != block)) {
          uVar4 = BasicBlock::id(block);
          uVar5 = StructuredControlState::CurrentMergeId
                            ((this->state_).
                             super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
          if (uVar4 == uVar5) {
            ppSVar1 = &(this->state_).
                       super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + -1;
          }
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock*const*,std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::BasicBlock*const>>
                            ((return_blocks->
                             super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (return_blocks->
                             super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish,&block);
          if ((_Var7._M_current !=
               (return_blocks->
               super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
               )._M_impl.super__Vector_impl_data._M_finish) &&
             (bVar3 = PredicateBlocks(this,block,&predicated,
                                      (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                                       *)p_Var9), !bVar3)) goto LAB_0021fb97;
          GenerateState(this,block);
        }
      }
      IRContext::RemoveDominatorAnalysis((this->super_MemPass).super_Pass.context_,local_98);
      AddNewPhiNodes(this);
LAB_0021fb97:
      std::
      _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&predicated._M_h);
      std::__cxx11::
      _List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      _M_clear(&order.
                super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              );
      return p_Var8 == p_Var9;
    }
  }
  return false;
}

Assistant:

bool MergeReturnPass::ProcessStructured(
    Function* function, const std::vector<BasicBlock*>& return_blocks) {
  if (HasNontrivialUnreachableBlocks(function)) {
    if (consumer()) {
      std::string message =
          "Module contains unreachable blocks during merge return.  Run dead "
          "branch elimination before merge return.";
      consumer()(SPV_MSG_ERROR, 0, {0, 0, 0}, message.c_str());
    }
    return false;
  }

  RecordImmediateDominators(function);
  if (!AddSingleCaseSwitchAroundFunction()) {
    return false;
  }

  std::list<BasicBlock*> order;
  cfg()->ComputeStructuredOrder(function, &*function->begin(), &order);

  state_.clear();
  state_.emplace_back(nullptr, nullptr);
  for (auto block : order) {
    if (cfg()->IsPseudoEntryBlock(block) || cfg()->IsPseudoExitBlock(block) ||
        block == final_return_block_) {
      continue;
    }

    auto blockId = block->GetLabelInst()->result_id();
    if (blockId == CurrentState().CurrentMergeId()) {
      // Pop the current state as we've hit the merge
      state_.pop_back();
    }

    ProcessStructuredBlock(block);

    // Generate state for next block if warranted
    GenerateState(block);
  }

  state_.clear();
  state_.emplace_back(nullptr, nullptr);
  std::unordered_set<BasicBlock*> predicated;
  for (auto block : order) {
    if (cfg()->IsPseudoEntryBlock(block) || cfg()->IsPseudoExitBlock(block)) {
      continue;
    }

    auto blockId = block->id();
    if (blockId == CurrentState().CurrentMergeId()) {
      // Pop the current state as we've hit the merge
      state_.pop_back();
    }

    // Predicate successors of the original return blocks as necessary.
    if (std::find(return_blocks.begin(), return_blocks.end(), block) !=
        return_blocks.end()) {
      if (!PredicateBlocks(block, &predicated, &order)) {
        return false;
      }
    }

    // Generate state for next block if warranted
    GenerateState(block);
  }

  // We have not kept the dominator tree up-to-date.
  // Invalidate it at this point to make sure it will be rebuilt.
  context()->RemoveDominatorAnalysis(function);
  AddNewPhiNodes();
  return true;
}